

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O3

void __thiscall luna::ParseException::ParseException(ParseException *this,char *str,TokenDetail *t)

{
  String *pSVar1;
  char local_52 [2];
  anon_union_16_2_eed97686_for_String_2 *local_50;
  char *str_local;
  string local_40;
  
  (this->super_Exception).what_._M_dataplus._M_p = (pointer)&(this->super_Exception).what_.field_2;
  (this->super_Exception).what_._M_string_length = 0;
  (this->super_Exception).what_.field_2._M_local_buf[0] = '\0';
  pSVar1 = t->module_;
  if ((pSVar1->super_GCObject).field_0x11 == '\0') {
    local_50 = &pSVar1->field_1;
  }
  else {
    local_50 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
  }
  local_52[1] = 0x3a;
  local_52[0] = ':';
  str_local = str;
  GetTokenStr_abi_cxx11_(&local_40,(luna *)t,t);
  Exception::
  SetWhat<char_const*,char,int_const&,char,int_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],char_const*&>
            (&this->super_Exception,(char **)&local_50,local_52 + 1,&t->line_,local_52,&t->column_,
             (char (*) [3])0x168f0e,&local_40,(char (*) [3])"\' ",&str_local);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

ParseException(const char *str, const TokenDetail &t)
        {
            SetWhat(t.module_->GetCStr(), ':', t.line_, ':', t.column_, " '",
                    GetTokenStr(t), "' ", str);
        }